

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isojoliet_rr.c
# Opt level: O0

void test_read_format_isojoliet_rr(void)

{
  archive *paVar1;
  char *unaff_retaddr;
  wchar_t in_stack_00000008;
  undefined4 in_stack_0000000c;
  char *in_stack_00000010;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  char *in_stack_00000048;
  void *in_stack_00000050;
  char *in_stack_000003d0;
  archive *in_stack_ffffffffffffffb8;
  archive *paVar2;
  archive_entry **entry;
  archive_entry *paVar3;
  archive_entry_conflict *paVar4;
  int64_t *piVar5;
  void *extra;
  archive *paVar6;
  int n;
  archive *in_stack_ffffffffffffffc0;
  uint uVar8;
  size_t *s;
  char *pcVar7;
  archive *in_stack_ffffffffffffffc8;
  archive *_a;
  undefined4 in_stack_ffffffffffffffd0;
  wchar_t in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  wchar_t in_stack_ffffffffffffffe4;
  archive_entry *in_stack_fffffffffffffff0;
  
  extract_reference_file(in_stack_000003d0);
  paVar1 = archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb8);
  archive_read_support_filter_all(in_stack_ffffffffffffffb8);
  paVar2 = (archive *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,0,
                      (char *)0x17f8d5,in_stack_fffffffffffffff0);
  archive_read_support_format_all(paVar2);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,0,
                      (char *)0x17f90d,in_stack_fffffffffffffff0);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
  entry = (archive_entry **)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,0,
                      (char *)0x17f94f,in_stack_fffffffffffffff0);
  archive_read_next_header(in_stack_ffffffffffffffc0,entry);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,0,
                      (char *)0x17f98c,in_stack_fffffffffffffff0);
  uVar8 = (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  archive_entry_pathname(paVar3);
  paVar6 = (archive *)((ulong)uVar8 << 0x20);
  assertion_equal_string
            ((char *)paVar1,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8,(char *)paVar6,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fa10,
                      in_stack_fffffffffffffff0);
  archive_entry_size(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fa4b,
                      in_stack_fffffffffffffff0);
  archive_entry_mtime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fa86,
                      in_stack_fffffffffffffff0);
  archive_entry_mtime_nsec(in_stack_fffffffffffffff0);
  paVar4 = (archive_entry_conflict *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fabe,
                      in_stack_fffffffffffffff0);
  archive_entry_stat(paVar4);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fafa,
                      in_stack_fffffffffffffff0);
  archive_entry_uid(in_stack_fffffffffffffff0);
  piVar5 = (int64_t *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fb35,
                      in_stack_fffffffffffffff0);
  archive_read_data_block
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (void **)in_stack_ffffffffffffffc8,(size_t *)paVar6,piVar5);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,(longlong)paVar1,
                      (char *)0x17fb7e,in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fbb2,
                      in_stack_fffffffffffffff0);
  archive_entry_is_encrypted(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fbeb,
                      in_stack_fffffffffffffff0);
  archive_read_has_encrypted_entries(in_stack_ffffffffffffffc8);
  paVar2 = paVar1;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,(longlong)paVar1,
                      (char *)0x17fc27,in_stack_fffffffffffffff0);
  archive_read_next_header(paVar6,(archive_entry **)paVar1);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fc64,
                      in_stack_fffffffffffffff0);
  archive_entry_pathname(paVar3);
  paVar6 = (archive *)((ulong)paVar6 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar2,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8,(char *)paVar6,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fce8,
                      in_stack_fffffffffffffff0);
  archive_entry_size(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fd23,
                      in_stack_fffffffffffffff0);
  archive_entry_mtime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fd5e,
                      in_stack_fffffffffffffff0);
  archive_entry_atime(in_stack_fffffffffffffff0);
  paVar4 = (archive_entry_conflict *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fd99,
                      in_stack_fffffffffffffff0);
  archive_entry_stat(paVar4);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fdd5,
                      in_stack_fffffffffffffff0);
  archive_entry_uid(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fe10,
                      in_stack_fffffffffffffff0);
  archive_entry_gid(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fe4b,
                      in_stack_fffffffffffffff0);
  archive_entry_is_encrypted(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fe84,
                      in_stack_fffffffffffffff0);
  archive_read_has_encrypted_entries(in_stack_ffffffffffffffc8);
  paVar1 = paVar2;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,(longlong)paVar2,
                      (char *)0x17fec0,in_stack_fffffffffffffff0);
  archive_read_next_header(paVar6,(archive_entry **)paVar2);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)paVar6,0,(char *)0x17fefd,
                      in_stack_fffffffffffffff0);
  archive_entry_pathname(paVar3);
  s = (size_t *)((ulong)paVar6 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar1,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (char *)in_stack_ffffffffffffffc8,(char *)s,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x17ff81,
                      in_stack_fffffffffffffff0);
  archive_entry_hardlink(paVar3);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffc8,(char *)s,paVar3);
  archive_entry_size(in_stack_fffffffffffffff0);
  piVar5 = (int64_t *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x17ffef,
                      in_stack_fffffffffffffff0);
  archive_read_data_block
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (void **)in_stack_ffffffffffffffc8,s,piVar5);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x180036,
                      in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x18006c,
                      in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      (longlong)in_stack_ffffffffffffffc8,(char *)s,0,(char *)0x18009c,
                      in_stack_fffffffffffffff0);
  paVar2 = (archive *)0x2e6187;
  _a = (archive *)0x0;
  assertion_equal_mem((char *)p,size._4_4_,(void *)offset,in_stack_00000010,
                      (void *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                      (size_t)refname,in_stack_00000048,in_stack_00000050);
  archive_entry_mtime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar2,0,(char *)0x180122,in_stack_fffffffffffffff0);
  archive_entry_nlink(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar2,0,(char *)0x18015f,in_stack_fffffffffffffff0);
  archive_entry_uid(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar2,0,(char *)0x18019a,in_stack_fffffffffffffff0);
  archive_entry_gid(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar2,0,(char *)0x1801d5,in_stack_fffffffffffffff0);
  archive_entry_is_encrypted(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar2,0,(char *)0x18020e,in_stack_fffffffffffffff0);
  archive_read_has_encrypted_entries(_a);
  paVar6 = paVar1;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar2,(longlong)paVar1,(char *)0x18024a,in_stack_fffffffffffffff0);
  archive_read_next_header(paVar2,(archive_entry **)paVar1);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar2,0,(char *)0x180287,in_stack_fffffffffffffff0);
  archive_entry_pathname(paVar3);
  pcVar7 = (char *)((ulong)paVar2 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar6,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)_a,pcVar7
             ,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,pcVar7,0,
                      (char *)0x18030b,in_stack_fffffffffffffff0);
  archive_entry_hardlink(paVar3);
  extra = (void *)0x0;
  paVar1 = (archive *)((ulong)pcVar7 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar6,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)_a,
             (char *)paVar1,unaff_retaddr,in_stack_00000008);
  archive_entry_size_is_set(in_stack_fffffffffffffff0);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,(char *)paVar1,extra);
  archive_entry_mtime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar1,0,(char *)0x1803c1,in_stack_fffffffffffffff0);
  archive_entry_atime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar1,0,(char *)0x1803fc,in_stack_fffffffffffffff0);
  archive_entry_nlink(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar1,0,(char *)0x180439,in_stack_fffffffffffffff0);
  archive_entry_uid(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar1,0,(char *)0x180474,in_stack_fffffffffffffff0);
  archive_entry_gid(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar1,0,(char *)0x1804af,in_stack_fffffffffffffff0);
  archive_entry_is_encrypted(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar1,0,(char *)0x1804e8,in_stack_fffffffffffffff0);
  archive_read_has_encrypted_entries(_a);
  paVar2 = paVar6;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar1,(longlong)paVar6,(char *)0x180524,in_stack_fffffffffffffff0);
  archive_read_next_header(paVar1,(archive_entry **)paVar6);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar1,0,(char *)0x180561,in_stack_fffffffffffffff0);
  archive_entry_pathname(paVar3);
  pcVar7 = (char *)((ulong)paVar1 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar2,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)_a,pcVar7
             ,unaff_retaddr,in_stack_00000008);
  archive_entry_filetype(in_stack_fffffffffffffff0);
  paVar3 = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,pcVar7,0,
                      (char *)0x1805e5,in_stack_fffffffffffffff0);
  archive_entry_symlink(paVar3);
  paVar6 = (archive *)((ulong)pcVar7 & 0xffffffff00000000);
  assertion_equal_string
            ((char *)paVar2,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),(char *)_a,
             (char *)paVar6,unaff_retaddr,in_stack_00000008);
  archive_entry_size(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x180664,in_stack_fffffffffffffff0);
  archive_entry_mtime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x18069f,in_stack_fffffffffffffff0);
  archive_entry_atime(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x1806da,in_stack_fffffffffffffff0);
  archive_entry_nlink(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x180717,in_stack_fffffffffffffff0);
  archive_entry_uid(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x180752,in_stack_fffffffffffffff0);
  archive_entry_gid(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x18078d,in_stack_fffffffffffffff0);
  archive_entry_is_encrypted(in_stack_fffffffffffffff0);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x1807c6,in_stack_fffffffffffffff0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,(longlong)paVar2,(char *)0x180802,in_stack_fffffffffffffff0);
  archive_read_next_header(paVar6,(archive_entry **)paVar2);
  n = 0;
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x180842,in_stack_fffffffffffffff0);
  archive_filter_code(paVar6,n);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x180880,in_stack_fffffffffffffff0);
  archive_format(paVar1);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x1808bc,in_stack_fffffffffffffff0);
  archive_read_close((archive *)0x1808c6);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,(longlong)paVar1,(char *)0x1808f5,in_stack_fffffffffffffff0);
  archive_read_free((archive *)0x1808ff);
  assertion_equal_int(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(longlong)_a,
                      (char *)paVar6,0,(char *)0x18092d,in_stack_fffffffffffffff0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isojoliet_rr)
{
	const char *refname = "test_read_format_iso_joliet_rockridge.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* First entry is '.' root directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("dir", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(86401, archive_entry_atime(ae));
	assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A regular file with two names ("hardlink" gets returned
	 * first, so it's not marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("hardlink",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assert(archive_entry_hardlink(ae) == NULL);
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(0, archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt(6, (int)size);
	assertEqualInt(0, offset);
	assertEqualMem(p, "hello\n", 6);
	assertEqualInt(86401, archive_entry_mtime(ae));
	/* mkisofs records their access time. */
	/*assertEqualInt(86401, archive_entry_atime(ae));*/
	/* TODO: Actually, libarchive should be able to
	 * compute nlinks correctly even without RR
	 * extensions. See comments in libarchive source. */
	assertEqualInt(2, archive_entry_nlink(ae));
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Second name for the same regular file (this happens to be
	 * returned second, so does get marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("long-joliet-file-name.textfile",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("hardlink",
	    archive_entry_hardlink(ae));
	assert(!archive_entry_size_is_set(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(86401, archive_entry_atime(ae));
	/* TODO: See above. */
	assertEqualInt(2, archive_entry_nlink(ae));
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A symlink to the regular file. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("symlink", archive_entry_pathname(ae));
	assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
	assertEqualString("long-joliet-file-name.textfile",
	    archive_entry_symlink(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualInt(172802, archive_entry_mtime(ae));
	assertEqualInt(172802, archive_entry_atime(ae));
	assertEqualInt(1, archive_entry_nlink(ae));
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}